

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.h
# Opt level: O2

char * absl::lts_20240722::LogSeverityName(LogSeverity s)

{
  if (s < 4) {
    return &DAT_00102050 + *(int *)(&DAT_00102050 + (ulong)s * 4);
  }
  return "UNKNOWN";
}

Assistant:

constexpr const char* LogSeverityName(absl::LogSeverity s) {
  switch (s) {
    case absl::LogSeverity::kInfo: return "INFO";
    case absl::LogSeverity::kWarning: return "WARNING";
    case absl::LogSeverity::kError: return "ERROR";
    case absl::LogSeverity::kFatal: return "FATAL";
  }
  return "UNKNOWN";
}